

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

double ibeta_appx(double x,double a,double b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double den;
  double num;
  double w2;
  double w1;
  double c2;
  double abx;
  double oup;
  double b_local;
  double a_local;
  double x_local;
  
  if ((x < 0.0) || (1.0 < x)) {
    printf("x only accepts real values between 0.0 and 1.0");
    exit(1);
  }
  if ((0.0 <= a) && (0.0 <= b)) {
    dVar1 = ((a + b) - 1.0) * (1.0 - x);
    if (0.8 < dVar1) {
      if (0.8 < dVar1) {
        dVar1 = pow(b * x,0.3333333333333333);
        dVar2 = pow(a * (1.0 - x),0.3333333333333333);
        dVar3 = sqrt(2.0);
        dVar4 = sqrt((dVar1 * dVar1) / b + (dVar2 * dVar2) / a);
        dVar1 = erfc((((dVar1 * (1.0 - 1.0 / (b * 9.0)) + -(dVar2 * (1.0 - 1.0 / (a * 9.0)))) * -3.0
                      ) / dVar3) / dVar4);
        abx = dVar1 / 2.0;
      }
    }
    else {
      abx = qgamma((dVar1 * (3.0 - x) + -((b - 1.0) * (1.0 - x))) / 2.0,b);
    }
    return abx;
  }
  printf(" The Two Inputs should be nonnegative and real");
  exit(1);
}

Assistant:

double ibeta_appx(double x, double a , double b) {
	double oup,abx,c2,w1,w2,num,den;
	/*
	 * Method 2. uses approximation and is based on equations 26.5.20 
	 * (pgamma/qgamma) and 26.5.21 (erf)
	 */ 
	 
	 if (x < 0. || x > 1.) {
		printf("x only accepts real values between 0.0 and 1.0");
		exit(1);
	}
	if (a < 0. || b < 0.) {
		printf(" The Two Inputs should be nonnegative and real");
		exit(1);
	}
	abx = (a+b-1) *(1.-x);
	if ( abx <= 0.8) {
		c2 = (abx * (3. - x) - (b - 1.) *(1. - x))/2.0;
		oup = qgamma(c2,b); //Incomplete Gamma Function Upper Tail
	} else if (abx > 0.8) {
		w1 = pow(b*x, (double) 1./3.);
		w2 = pow(a*(1. - x), (double) 1./3.);
		num = - 3.0 * (w1 * (1. - 1./(9. * b)) - w2 * (1. - 1./ (9. * a)))/sqrt(2);
		den = sqrt((w1 * w1 / b) + (w2 * w2 / a) ); 
		oup = erfc(num/den) / 2.0;
	}
	 
	return oup;
	
}